

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decomp.c
# Opt level: O0

void ddb_h1(long ndims,Integer *ardims,long npes,double threshold,Integer *blk,Integer *pedims)

{
  Integer IVar1;
  long *ardims_00;
  double *__ptr;
  void *__ptr_00;
  Integer *in_RCX;
  Integer *in_RDX;
  Integer *in_RSI;
  size_t in_RDI;
  Integer *in_R8;
  double in_XMM0_Qa;
  double dVar2;
  double dVar3;
  double blb;
  double ub;
  double cb;
  double q;
  double t;
  long npdivs;
  Integer *tard;
  Integer *apdims;
  long *pdivs;
  double *qedims;
  long k;
  long j;
  long i;
  long h;
  long local_b0;
  long local_a8;
  double local_98;
  long in_stack_ffffffffffffff78;
  long in_stack_ffffffffffffff80;
  Integer *pIVar4;
  double *in_stack_ffffffffffffff98;
  long *in_stack_ffffffffffffffb0;
  long lVar5;
  Integer *pIVar6;
  Integer *pIVar7;
  Integer *local_48;
  long local_40;
  
  if (in_RDI == 1) {
    *in_R8 = (Integer)in_RDX;
    dd_ev(1,in_RSI,in_R8);
    dd_su(1,in_RSI,in_R8,in_RCX);
  }
  else {
    ardims_00 = (long *)calloc(in_RDI,8);
    if (ardims_00 == (long *)0x0) {
      fprintf(_stderr,"%s: %s\n","ddb_h1","memory allocation failed");
      for (local_40 = 0; local_40 < (long)in_RDI; local_40 = local_40 + 1) {
        in_RCX[local_40] = 0;
      }
    }
    else {
      for (local_40 = 0; local_40 < (long)in_RDI; local_40 = local_40 + 1) {
        if (in_RCX[local_40] < 1) {
          in_RCX[local_40] = 1;
        }
      }
      for (local_40 = 0; local_40 < (long)in_RDI; local_40 = local_40 + 1) {
        ardims_00[local_40] = in_RSI[local_40] / in_RCX[local_40];
      }
      for (local_40 = 0; local_40 < (long)in_RDI; local_40 = local_40 + 1) {
        if (ardims_00[local_40] < 1) {
          ardims_00[local_40] = 1;
          in_RCX[local_40] = in_RSI[local_40];
        }
      }
      __ptr = (double *)calloc(in_RDI,8);
      if (__ptr == (double *)0x0) {
        fprintf(_stderr,"%s: %s\n","ddb_h1","memory allocation failed");
        for (local_40 = 0; local_40 < (long)in_RDI; local_40 = local_40 + 1) {
          in_RCX[local_40] = 0;
        }
        free(ardims_00);
      }
      else {
        *__ptr = (double)(long)in_RDX;
        for (local_40 = 1; local_40 < (long)in_RDI; local_40 = local_40 + 1) {
          *__ptr = *__ptr / ((double)ardims_00[local_40] / (double)*ardims_00);
        }
        dVar2 = pow(*__ptr,1.0 / (double)(long)in_RDI);
        *__ptr = dVar2;
        for (local_40 = 1; local_40 < (long)in_RDI; local_40 = local_40 + 1) {
          __ptr[local_40] = ((double)ardims_00[local_40] / (double)*ardims_00) * *__ptr;
        }
        pIVar4 = (Integer *)0x1;
        for (local_40 = 2; local_40 <= (long)in_RDX; local_40 = local_40 + 1) {
          if ((long)in_RDX % local_40 == 0) {
            pIVar4 = (Integer *)((long)pIVar4 + 1);
          }
        }
        __ptr_00 = calloc((size_t)pIVar4,8);
        if (__ptr_00 == (void *)0x0) {
          fprintf(_stderr,"%s: %s\n","split","memory allocation failed");
          for (local_40 = 0; local_40 < (long)in_RDI; local_40 = local_40 + 1) {
            in_RCX[local_40] = 0;
          }
          free(ardims_00);
          free(__ptr);
        }
        else {
          local_48 = (Integer *)0x0;
          for (local_40 = 1; local_40 <= (long)in_RDX; local_40 = local_40 + 1) {
            if ((long)in_RDX % local_40 == 0) {
              *(long *)((long)__ptr_00 + (long)local_48 * 8) = local_40;
              local_48 = (Integer *)((long)local_48 + 1);
            }
          }
          ddb_ap((long)__ptr_00,in_stack_ffffffffffffff98,ardims_00,pIVar4,in_stack_ffffffffffffff80
                 ,in_stack_ffffffffffffff78,in_stack_ffffffffffffffb0);
          free(__ptr);
          free(__ptr_00);
          pIVar4 = (Integer *)calloc(in_RDI,8);
          if (pIVar4 == (Integer *)0x0) {
            fprintf(_stderr,"%s: %s\n","split","memory allocation failed");
            for (local_40 = 0; local_40 < (long)in_RDI; local_40 = local_40 + 1) {
              in_RCX[local_40] = 0;
            }
            free(ardims_00);
          }
          else {
            local_98 = dd_ev(in_RDI,ardims_00,in_R8);
            for (lVar5 = 0; lVar5 < (long)in_RDI; lVar5 = lVar5 + 1) {
              pIVar4[lVar5] = in_R8[lVar5];
            }
            do {
              dVar2 = local_98;
              for (lVar5 = 0; lVar5 < (long)in_RDI; lVar5 = lVar5 + 1) {
                in_R8[lVar5] = pIVar4[lVar5];
              }
              local_48 = (Integer *)0x0;
              if (*ardims_00 < *in_R8) {
                local_a8 = *in_R8;
              }
              else {
                local_a8 = *ardims_00 % *in_R8;
              }
              dVar3 = (double)local_a8 / (double)*in_R8;
              for (pIVar6 = (Integer *)0x1; (long)pIVar6 < (long)in_RDI;
                  pIVar6 = (Integer *)((long)pIVar6 + 1)) {
                if (ardims_00[(long)pIVar6] < in_R8[(long)pIVar6]) {
                  local_b0 = in_R8[(long)pIVar6];
                }
                else {
                  local_b0 = ardims_00[(long)pIVar6] % in_R8[(long)pIVar6];
                }
                if (dVar3 < (double)local_b0 / (double)in_R8[(long)pIVar6]) {
                  dVar3 = (double)local_b0 / (double)in_R8[(long)pIVar6];
                  local_48 = pIVar6;
                }
              }
              pIVar6 = local_48;
              for (pIVar7 = (Integer *)0x0; (long)pIVar7 < (long)in_RDI;
                  pIVar7 = (Integer *)((long)pIVar7 + 1)) {
                if (pIVar7 != pIVar6) {
                  IVar1 = pIVar4[(long)pIVar6];
                  pIVar4[(long)pIVar6] = pIVar4[(long)pIVar7];
                  pIVar4[(long)pIVar7] = IVar1;
                  dVar3 = dd_ev(in_RDI,ardims_00,pIVar4);
                  if (local_98 < dVar3) {
                    local_98 = dVar3;
                    local_48 = pIVar7;
                  }
                  IVar1 = pIVar4[(long)pIVar6];
                  pIVar4[(long)pIVar6] = pIVar4[(long)pIVar7];
                  pIVar4[(long)pIVar7] = IVar1;
                }
              }
              if (local_48 != pIVar6) {
                IVar1 = pIVar4[(long)pIVar6];
                pIVar4[(long)pIVar6] = pIVar4[(long)local_48];
                pIVar4[(long)local_48] = IVar1;
              }
            } while (dVar2 < local_98);
            for (local_40 = 0; local_40 < (long)in_RDI; local_40 = local_40 + 1) {
              in_R8[local_40] = pIVar4[local_40];
            }
            free(pIVar4);
            if (local_98 < in_XMM0_Qa) {
              ddb_ex((long)in_RSI,in_RDX,(long)in_XMM0_Qa,(double)in_RCX,in_R8,pIVar6);
            }
            free(ardims_00);
            dd_su(in_RDI,in_RSI,in_R8,in_RCX);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void ddb_h1(long ndims, Integer ardims[], long npes, double threshold,
           Integer blk[], Integer pedims[])
      {
      long h, i, j, k;
      double * qedims;
      long * pdivs;
      Integer * apdims;
	  Integer *tard;
      long npdivs;
      double t, q;
      double cb, ub, blb;
      if(ndims==1) {
         pedims[0] = npes;
         blb = dd_ev(ndims,ardims,pedims);
         dd_su(ndims,ardims,pedims,blk);
         return;
      }

      /*- Allocate memory to store the granularity -*/
      tard = (Integer *) calloc((size_t)ndims,sizeof(Integer));
      if(tard==NULL){
         fprintf(stderr,"%s: %s\n","ddb_h1",
             "memory allocation failed");
         for(i=0;i<ndims;i++) blk[i] = 0;
         return;
      }
      /*- Reset array dimensions to reflect granularity -*/
      for(i=0;i<ndims;i++) if (blk[i]<1) blk[i] = 1;
      for(i=0;i<ndims;i++) tard[i] = ardims[i] / blk[i];
      for(i=0;i<ndims;i++) if (tard[i]<1) {
         tard[i] = 1; blk[i] = ardims[i];}

      /*- First solve the load balancing problem exactly in
       *- floating point arithmetic -*/
      qedims = (double *) calloc((size_t)ndims,sizeof(double));
      if(qedims==NULL){
         fprintf(stderr,"%s: %s\n","ddb_h1",
             "memory allocation failed");
         for(i=0;i<ndims;i++) blk[i] = 0;
         free(tard);
         return;
      }

      qedims[0] = (double) npes;
      for(i=1;i<ndims;i++) qedims[0] /= (tard[i]/(double)tard[0]);
      qedims[0] = pow(qedims[0],1.0/ndims);

      for(i=1;i<ndims;i++){
          qedims[i] = (tard[i]/(double)tard[0])*qedims[0];
      };

      /*- Set up the search for a integer approximation the floating point solution -*/
      npdivs = 1;
      for(i=2;i<=npes;i++) if(npes%i==0) npdivs += 1;
      pdivs = (long *) calloc((size_t)npdivs,sizeof(long));
      if(pdivs==NULL){
         fprintf(stderr,"%s: %s\n","split",
             "memory allocation failed");
         for(i=0;i<ndims;i++) blk[i] = 0;
         free(tard);
         free(qedims);
         return;
      }
      /*- Compute the discrete approximation -*/
      for(j=0,i=1;i<=npes;i++) if(npes%i==0) pdivs[j++] = i;
      ddb_ap(ndims,qedims,tard,pedims,npes,npdivs,pdivs) ; 
      free(qedims);
      free(pdivs);


      /*- Lookout for a permutation of the solution vector
       *- that would improve the initial solution -*/
      apdims = (Integer *) calloc((size_t)ndims,sizeof(Integer));
      if(apdims==NULL){
         fprintf(stderr,"%s: %s\n","split",
             "memory allocation failed");
         for(i=0;i<ndims;i++) blk[i] = 0;
         free(tard);
         return;
      }

      ub = dd_ev(ndims,tard,pedims);
      for(k=0;k<ndims;k++) apdims[k] = pedims[k];

      do {
         for(k=0;k<ndims;k++) pedims[k] = apdims[k];
         blb = ub;

         /*- Find the worst distributed dimension -*/
         h = 0;
         q = (tard[0]<pedims[0]) ? pedims[0] : tard[0]%pedims[0];
         q /= (double)pedims[0];
         for(k=1;k<ndims;k++){
            t = (tard[k]<pedims[k]) ? pedims[k] : tard[k]%pedims[k];
            t /= (double) pedims[k];
            if(t>q) {
              h = k; q = t;
            }
         }

         /*- Swap elements of apdims to improve load balance */
         j = h;
         for(k=0;k<ndims;k++){
            if(k==h) continue;
            i = apdims[h]; apdims[h] = apdims[k]; apdims[k] = i;
            cb = dd_ev(ndims,tard,apdims);
            if(cb>ub) {
              j = k;
              ub = cb;
            }
            i = apdims[h]; apdims[h] = apdims[k]; apdims[k] = i;
         }
         if(j!=h){
            i = apdims[h]; apdims[h] = apdims[j]; apdims[j] = i;
         }
      } while (ub > blb);

      for(i=0;i<ndims;i++) pedims[i] = apdims[i];
      blb = ub;
      free(apdims);

      /*- Do an exhaustive search is the heuristic returns a solution 
       *- whose load balance ratio is less than the given threshold. -*/
      if(blb<threshold) ddb_ex(ndims,tard,npes,threshold,blk,pedims);

      free(tard);

      dd_su(ndims,ardims,pedims,blk);

      return;
      }